

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O2

bool Kernel::SortHelper::areSortsValid
               (Term *t0,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *varSorts)

{
  Term *t;
  Term **ppTVar1;
  Term **ppTVar2;
  bool bVar3;
  TermList t_00;
  TermList TVar4;
  uint argIndex;
  uint *puVar5;
  TermList argSrt;
  TermList varSrt;
  NonVariableIterator sit;
  
  NonVariableIterator::NonVariableIterator(&sit,t0,true);
  while (ppTVar2 = sit._stack._cursor, ppTVar1 = sit._stack._stack,
        sit._stack._cursor != sit._stack._stack) {
    t_00 = NonVariableIterator::next(&sit);
    argIndex = 0;
    for (puVar5 = (uint *)((ulong)(*(uint *)(t_00._content + 0xc) & 0xfffffff) * 8 + 0x28 +
                          t_00._content); (*puVar5 & 3) != 2; puVar5 = puVar5 + -2) {
      argSrt = getArgSort(t_00._content,argIndex);
      t = *(Term **)puVar5;
      if (((ulong)t & 1) == 0) {
        TVar4 = getResultSort(t);
        if (argSrt._content != TVar4._content) goto LAB_0048dcfc;
      }
      else {
        varSrt._content = 2;
        bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                findOrInsert(varSorts,(uint)((ulong)t >> 2),&varSrt,&argSrt);
        if ((!bVar3) && (varSrt._content != argSrt._content)) goto LAB_0048dcfc;
      }
      argIndex = argIndex + 1;
    }
  }
LAB_0048dcfc:
  NonVariableIterator::~NonVariableIterator(&sit);
  return ppTVar2 == ppTVar1;
}

Assistant:

bool SortHelper::areSortsValid(Term* t0, DHMap<unsigned,TermList>& varSorts)
{
  NonVariableIterator sit(t0,true);
  while (sit.hasNext()) {
    Term* t = sit.next().term();
    int idx = 0;
    TermList* args = t->args();
    while (!args->isEmpty()) {
      TermList argSrt = getArgSort(t,idx);
      TermList arg = *args;
      if (arg.isVar()) {
        TermList varSrt;
        if (!varSorts.findOrInsert(arg.var(), varSrt, argSrt)) {
          //the variable is not new
          if (varSrt != argSrt) {
            return false;
          }
        }
      } else {
        if (argSrt != getResultSort(arg.term())) {
          return false;
        }
      }
      idx++;
      args=args->next();
    }
  }
  return true;
}